

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O3

aom_codec_err_t decoder_init(aom_codec_ctx_t *ctx)

{
  aom_codec_dec_cfg *paVar1;
  aom_codec_flags_t aVar2;
  aom_codec_priv_t *paVar3;
  aom_codec_err_t aVar4;
  
  aVar4 = AOM_CODEC_OK;
  if (ctx->priv == (aom_codec_priv_t *)0x0) {
    paVar3 = (aom_codec_priv_t *)aom_calloc(1,0x6b30);
    if (paVar3 == (aom_codec_priv_t *)0x0) {
      aVar4 = AOM_CODEC_MEM_ERROR;
    }
    else {
      ctx->priv = paVar3;
      paVar3->init_flags = ctx->init_flags;
      *(undefined4 *)((long)&paVar3[2].err_detail + 4) = 0;
      *(undefined4 *)((long)&paVar3[1].init_flags + 4) = 1;
      paVar1 = (ctx->config).dec;
      if (paVar1 != (aom_codec_dec_cfg *)0x0) {
        aVar2 = *(aom_codec_flags_t *)&paVar1->h;
        paVar3[1].err_detail = *(char **)paVar1;
        paVar3[1].init_flags = aVar2;
        (ctx->config).dec = (aom_codec_dec_cfg *)(paVar3 + 1);
      }
      paVar3[0x83].enc.cx_data_pkt.data.psnr.sse_hbd[0] = 0;
      paVar3[2].enc.cx_data_pkt.data.psnr.samples[1] = 1;
      *(undefined4 *)&paVar3[2].enc.cx_data_pkt.field_0x4 = 0;
      paVar3[2].enc.cx_data_pad_after = 0xffffffff;
      paVar3[2].enc.cx_data_pkt.kind = ~AOM_CODEC_CX_FRAME_PKT;
      aVar4 = AOM_CODEC_OK;
    }
  }
  return aVar4;
}

Assistant:

static aom_codec_err_t decoder_init(aom_codec_ctx_t *ctx) {
  // This function only allocates space for the aom_codec_alg_priv_t
  // structure. More memory may be required at the time the stream
  // information becomes known.
  if (!ctx->priv) {
    aom_codec_alg_priv_t *const priv =
        (aom_codec_alg_priv_t *)aom_calloc(1, sizeof(*priv));
    if (priv == NULL) return AOM_CODEC_MEM_ERROR;

    ctx->priv = (aom_codec_priv_t *)priv;
    ctx->priv->init_flags = ctx->init_flags;
    priv->flushed = 0;

    // TODO(tdaede): this should not be exposed to the API
    priv->cfg.allow_lowbitdepth = !FORCE_HIGHBITDEPTH_DECODING;
    if (ctx->config.dec) {
      priv->cfg = *ctx->config.dec;
      ctx->config.dec = &priv->cfg;
    }
    priv->num_grain_image_frame_buffers = 0;
    // Turn row_mt on by default.
    priv->row_mt = 1;

    // Turn on normal tile coding mode by default.
    // 0 is for normal tile coding mode, and 1 is for large scale tile coding
    // mode(refer to lightfield example).
    priv->tile_mode = 0;
    priv->decode_tile_row = -1;
    priv->decode_tile_col = -1;
  }

  return AOM_CODEC_OK;
}